

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool local_26;
  ImVec2 local_24;
  ImVec2 pos;
  bool window_disappared;
  ImGuiWindow *moving_window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (GImGui->MovingWindow == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    if (GImGui->ActiveIdWindow->MoveId != GImGui->ActiveId) {
      return;
    }
    KeepAliveID(GImGui->ActiveId);
    if (((pIVar2->IO).MouseDown[0] & 1U) != 0) {
      return;
    }
    ClearActiveID();
    return;
  }
  KeepAliveID(GImGui->ActiveId);
  bVar3 = false;
  if (pIVar2->MovingWindow != (ImGuiWindow *)0x0) {
    bVar3 = pIVar2->MovingWindow->RootWindowDockTree != (ImGuiWindow *)0x0;
  }
  if (!bVar3) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindowDockTree",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                  ,0xf7a,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  unique0x00012000 = pIVar2->MovingWindow->RootWindowDockTree;
  local_26 = true;
  if ((unique0x00012000->WasActive & 1U) != 0) {
    local_26 = unique0x00012000->Viewport == (ImGuiViewportP *)0x0;
  }
  pos.x._3_1_ = local_26;
  if (((((pIVar2->IO).MouseDown[0] & 1U) == 0) ||
      (bVar3 = IsMousePosValid(&(pIVar2->IO).MousePos), !bVar3)) || ((pos.x._3_1_ & 1) != 0)) {
    if ((pos.x._3_1_ & 1) == 0) {
      if ((pIVar2->ConfigFlagsCurrFrame & 0x400U) != 0) {
        UpdateTryMergeWindowIntoHostViewport(stack0xffffffffffffffe8,pIVar2->MouseViewport);
      }
      bVar3 = IsDragDropPayloadBeingAccepted();
      if (!bVar3) {
        pIVar2->MouseViewport = stack0xffffffffffffffe8->Viewport;
      }
      (stack0xffffffffffffffe8->Viewport->super_ImGuiViewport).Flags =
           (stack0xffffffffffffffe8->Viewport->super_ImGuiViewport).Flags & 0xffffff7f;
    }
    pIVar2->MovingWindow = (ImGuiWindow *)0x0;
    ClearActiveID();
    return;
  }
  local_24 = ::operator-(&(pIVar2->IO).MousePos,&pIVar2->ActiveIdClickOffset);
  fVar1 = (stack0xffffffffffffffe8->Pos).x;
  if ((fVar1 == local_24.x) && (!NAN(fVar1) && !NAN(local_24.x))) {
    fVar1 = (stack0xffffffffffffffe8->Pos).y;
    if ((fVar1 == local_24.y) && (!NAN(fVar1) && !NAN(local_24.y))) goto LAB_0019a28b;
  }
  MarkIniSettingsDirty(stack0xffffffffffffffe8);
  SetWindowPos(stack0xffffffffffffffe8,&local_24,1);
  if ((stack0xffffffffffffffe8->ViewportOwned & 1U) != 0) {
    (stack0xffffffffffffffe8->Viewport->super_ImGuiViewport).Pos = local_24;
    ImGuiViewportP::UpdateWorkRect(stack0xffffffffffffffe8->Viewport);
  }
LAB_0019a28b:
  FocusWindow(pIVar2->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindowDockTree);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindowDockTree;

        // When a window stop being submitted while being dragged, it may will its viewport until next Begin()
        const bool window_disappared = (!moving_window->WasActive || moving_window->Viewport == NULL);
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos) && !window_disappared)
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                {
                    moving_window->Viewport->Pos = pos;
                    moving_window->Viewport->UpdateWorkRect();
                }
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            if (!window_disappared)
            {
                // Try to merge the window back into the main viewport.
                // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
                if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                    UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

                // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
                if (!IsDragDropPayloadBeingAccepted())
                    g.MouseViewport = moving_window->Viewport;

                // Clear the NoInput window flag set by the Viewport system
                moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs; // FIXME-VIEWPORT: Test engine managed to crash here because Viewport was NULL.
            }

            g.MovingWindow = NULL;
            ClearActiveID();
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}